

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O1

Abc_Cex_t * Abc_CexTransformUndc(Abc_Cex_t *p,char *pInit)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  Abc_Cex_t *__s;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  
  sVar6 = strlen(pInit);
  uVar13 = 0;
  iVar11 = 0;
  uVar8 = (uint)sVar6;
  if (0 < (int)uVar8) {
    uVar10 = 0;
    iVar11 = 0;
    do {
      iVar11 = iVar11 + (uint)(pInit[uVar10] == 'x');
      uVar10 = uVar10 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar10);
  }
  iVar2 = p->iFrame;
  iVar3 = p->nPis;
  iVar4 = iVar3 - iVar11;
  uVar7 = (iVar2 + 1) * iVar4 + uVar8;
  sVar6 = (long)(int)((((int)uVar7 >> 5) + 1) - (uint)((uVar7 & 0x1f) == 0)) * 4 + 0x14;
  __s = (Abc_Cex_t *)malloc(sVar6);
  memset(__s,0,sVar6);
  __s->nRegs = uVar8;
  __s->nPis = iVar4;
  __s->nBits = uVar7;
  __s->iPo = p->iPo;
  __s->iFrame = iVar2;
  iVar5 = 0;
  if (0 < (int)uVar8) {
    uVar13 = 0;
    iVar5 = 0;
    do {
      cVar1 = pInit[uVar13];
      if ((cVar1 == '1') ||
         ((cVar1 == 'x' &&
          (uVar7 = iVar4 + iVar5 + p->nRegs,
          ((uint)(&p[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0)))) {
        (&__s[1].iPo)[uVar13 >> 5 & 0x7ffffff] =
             (&__s[1].iPo)[uVar13 >> 5 & 0x7ffffff] | 1 << ((byte)uVar13 & 0x1f);
      }
      iVar5 = iVar5 + (uint)(cVar1 == 'x');
      uVar13 = uVar13 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar13);
  }
  iVar4 = (int)uVar13;
  if (iVar5 != iVar11) {
    __assert_fail("iAddPi == nAddPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                  ,0x1d2,"Abc_Cex_t *Abc_CexTransformUndc(Abc_Cex_t *, char *)");
  }
  if (-1 < iVar2) {
    iVar5 = 0;
    iVar11 = 0;
    do {
      if (0 < __s->nPis) {
        iVar4 = p->nRegs;
        iVar12 = 0;
        do {
          uVar8 = iVar4 + iVar5 + iVar12;
          if (((uint)(&p[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0) {
            iVar9 = (int)uVar13 + iVar12;
            (&__s[1].iPo)[iVar9 >> 5] = (&__s[1].iPo)[iVar9 >> 5] | 1 << ((byte)iVar9 & 0x1f);
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 < __s->nPis);
        uVar13 = (ulong)(uint)((int)uVar13 + iVar12);
      }
      iVar4 = (int)uVar13;
      iVar5 = iVar5 + iVar3;
      bVar14 = iVar11 != iVar2;
      iVar11 = iVar11 + 1;
    } while (bVar14);
  }
  if (iVar4 == __s->nBits) {
    return __s;
  }
  __assert_fail("iBit == pCex->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                ,0x1d8,"Abc_Cex_t *Abc_CexTransformUndc(Abc_Cex_t *, char *)");
}

Assistant:

Abc_Cex_t * Abc_CexTransformUndc( Abc_Cex_t * p, char * pInit )
{
    Abc_Cex_t * pCex;
    int nFlops = strlen(pInit);
    int i, f, iBit, iAddPi = 0, nAddPis = 0;
    // count how many flops got a new PI
    for ( i = 0; i < nFlops; i++ )
        nAddPis += (int)(pInit[i] == 'x');
    // create new CEX
    pCex = Abc_CexAlloc( nFlops, p->nPis - nAddPis, p->iFrame + 1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = p->iFrame;
    for ( iBit = 0; iBit < nFlops; iBit++ )
    {
        if ( pInit[iBit] == '1' || (pInit[iBit] == 'x' && Abc_InfoHasBit(p->pData, p->nRegs + p->nPis - nAddPis + iAddPi)) )
            Abc_InfoSetBit( pCex->pData, iBit );
        iAddPi += (int)(pInit[iBit] == 'x');
    }
    assert( iAddPi == nAddPis );
    // add timeframes
    for ( f = 0; f <= p->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + p->nPis * f + i) )
                Abc_InfoSetBit( pCex->pData, iBit );
    assert( iBit == pCex->nBits );
    return pCex;
}